

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void provide_xrm_string(char *string,char *progname)

{
  undefined8 *e;
  void *pvVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  skeyval *ret;
  skeyval *xrms;
  char *key;
  char *q;
  char *p;
  char *progname_local;
  char *string_local;
  
  q = strchr(string,0x3a);
  if (q == (char *)0x0) {
    fprintf(_stderr,"%s: expected a colon in resource string \"%s\"\n",progname,string);
  }
  else {
    key = q + 1;
    while( true ) {
      bVar4 = false;
      if ((string < q) && (bVar4 = false, q[-1] != '.')) {
        bVar4 = q[-1] != '*';
      }
      if (!bVar4) break;
      q = q + -1;
    }
    e = (undefined8 *)safemalloc(1,0x10,0);
    pvVar1 = safemalloc((long)key - (long)q,1,0);
    memcpy(pvVar1,q,(long)key - (long)q);
    *(char *)((long)pvVar1 + (long)(key + (-1 - (long)q))) = '\0';
    *e = pvVar1;
    while( true ) {
      bVar4 = false;
      if (*key != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)(uint)(byte)*key] & 0x2000) != 0;
      }
      if (!bVar4) break;
      key = key + 1;
    }
    pcVar3 = dupstr(key);
    e[1] = pcVar3;
    if (xrmtree == (tree234 *)0x0) {
      xrmtree = newtree234(keycmp);
    }
    pvVar1 = add234(xrmtree,e);
    if (pvVar1 != (void *)0x0) {
      del234(xrmtree,pvVar1);
      add234(xrmtree,e);
    }
  }
  return;
}

Assistant:

void provide_xrm_string(const char *string, const char *progname)
{
    const char *p, *q;
    char *key;
    struct skeyval *xrms, *ret;

    p = q = strchr(string, ':');
    if (!q) {
        fprintf(stderr, "%s: expected a colon in resource string"
                " \"%s\"\n", progname, string);
        return;
    }
    q++;
    while (p > string && p[-1] != '.' && p[-1] != '*')
        p--;
    xrms = snew(struct skeyval);
    key = snewn(q-p, char);
    memcpy(key, p, q-p);
    key[q-p-1] = '\0';
    xrms->key = key;
    while (*q && isspace((unsigned char)*q))
        q++;
    xrms->value = dupstr(q);

    if (!xrmtree)
        xrmtree = newtree234(keycmp);

    ret = add234(xrmtree, xrms);
    if (ret) {
        /* Override an existing string. */
        del234(xrmtree, ret);
        add234(xrmtree, xrms);
    }
}